

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O3

void __thiscall
Minisat::Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::percolateDown
          (Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_> *this,int i)

{
  Var y;
  bool bVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  piVar3 = (this->heap).data;
  lVar4 = (long)i;
  y = piVar3[lVar4];
  iVar5 = i * 2 + 1;
  iVar2 = (this->heap).sz;
  if (iVar5 < iVar2) {
    iVar6 = i * 2;
    do {
      iVar7 = iVar6 + 2;
      if (iVar7 < iVar2) {
        bVar1 = Solver::VarOrderLt::operator()(&this->lt,piVar3[iVar7],piVar3[iVar5]);
        lVar4 = (long)iVar7;
        if (!bVar1) {
          lVar4 = (long)iVar5;
          iVar7 = iVar5;
        }
      }
      else {
        lVar4 = (long)iVar5;
        iVar7 = iVar5;
      }
      bVar1 = Solver::VarOrderLt::operator()(&this->lt,(this->heap).data[lVar4],y);
      piVar3 = (this->heap).data;
      if (!bVar1) break;
      iVar2 = piVar3[lVar4];
      piVar3[i] = iVar2;
      if ((this->indices).map.sz <= iVar2) goto LAB_0010d396;
      (this->indices).map.data[iVar2] = i;
      iVar6 = iVar7 * 2;
      iVar5 = iVar7 * 2 + 1;
      iVar2 = (this->heap).sz;
      i = iVar7;
    } while (iVar5 < iVar2);
    lVar4 = (long)i;
  }
  piVar3[lVar4] = y;
  if (y < (this->indices).map.sz) {
    (this->indices).map.data[y] = i;
    return;
  }
LAB_0010d396:
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                ,0x28,
                "V &Minisat::IntMap<int, int>::operator[](K) [K = int, V = int, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

void percolateDown(int i)
    {
        K x = heap[i];
        while (left(i) < heap.size()){
            int child = right(i) < heap.size() && lt(heap[right(i)], heap[left(i)]) ? right(i) : left(i);
            if (!lt(heap[child], x)) break;
            heap[i]          = heap[child];
            indices[heap[i]] = i;
            i                = child;
        }
        heap   [i] = x;
        indices[x] = i;
    }